

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_package.cpp
# Opt level: O1

bool __thiscall ParsePackage::ParseType(ParsePackage *this,char *buf,int len,int *type)

{
  int iVar1;
  bool bVar2;
  char typec [4];
  uint local_c;
  
  if (buf == (char *)0x0) {
    return false;
  }
  bVar2 = 0xf5 < (byte)(*buf - 0x3aU);
  if (bVar2) {
    local_c = (uint)(byte)*buf;
    iVar1 = atoi((char *)&local_c);
    *type = iVar1;
  }
  return bVar2;
}

Assistant:

bool ParsePackage::ParseType(char* buf, int len, int& type) {
    if (!buf) {
        return false;
    }
    if (*buf < '0' || *buf > '9') {
        return false;
    }

    char typec[4] = { 0 };
    memcpy(typec, buf, 1);
    type = atoi(typec);
    return true;
}